

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::Wrap<std::istream_iterator<std::__cxx11::string,char,std::char_traits<char>,long>>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,args *this,
          istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
          *begin,istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                 *end,size_type width,size_type firstlinewidth,size_type firstlineindent)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  long lVar4;
  string line;
  istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
  it;
  value_type local_80;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  size_type local_50;
  char local_48 [16];
  args local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_80,(char)firstlinewidth);
  local_60 = *(undefined1 (*) [8])this;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,*(long *)(this + 8),*(long *)(this + 0x10) + *(long *)(this + 8));
  if (width == 0) {
    width = (size_type)end;
  }
  local_38 = this[0x28];
  bVar1 = true;
  while ((local_38 != (args)begin->_M_ok ||
         ((local_38 != (args)0x0 && (local_60 != (undefined1  [8])begin->_M_stream))))) {
    if (local_50 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_58);
      if (iVar2 == 0) {
        if (!bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_80);
          local_80._M_string_length = 0;
          *local_80._M_dataplus._M_p = '\0';
          bVar1 = true;
          width = (size_type)end;
        }
      }
      else {
        if (local_50 == 0) {
          lVar4 = 0;
        }
        else {
          sVar3 = 0;
          lVar4 = 0;
          do {
            lVar4 = lVar4 + 1;
            sVar3 = sVar3 + 1;
          } while (local_50 != sVar3);
        }
        if ((width < (istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
                      *)(local_80._M_string_length + lVar4 + 1)) && (!bVar1)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__return_storage_ptr__,&local_80);
          local_80._M_string_length = 0;
          *local_80._M_dataplus._M_p = '\0';
          bVar1 = true;
          width = (size_type)end;
        }
        if (lVar4 != 0) {
          if (!bVar1) {
            std::__cxx11::string::push_back((char)&local_80);
          }
          std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_58._M_p);
          bVar1 = false;
        }
      }
    }
    std::
    istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
    ::_M_read((istream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>,_long>
               *)local_60);
  }
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_80);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> Wrap(It begin,
                                         It end,
                                         const std::string::size_type width,
                                         std::string::size_type firstlinewidth = 0,
                                         std::string::size_type firstlineindent = 0)
    {
        std::vector<std::string> output;
        std::string line(firstlineindent, ' ');
        bool empty = true;

        if (firstlinewidth == 0)
        {
            firstlinewidth = width;
        }

        auto currentwidth = firstlinewidth;

        for (auto it = begin; it != end; ++it)
        {
            if (it->empty())
            {
                continue;
            }

            if (*it == "\n")
            {
                if (!empty)
                {
                    output.push_back(line);
                    line.clear();
                    empty = true;
                    currentwidth = width;
                }

                continue;
            }

            auto itemsize = Glyphs(*it);
            if ((line.length() + 1 + itemsize) > currentwidth)
            {
                if (!empty)
                {
                    output.push_back(line);
                    line.clear();
                    empty = true;
                    currentwidth = width;
                }
            }

            if (itemsize > 0)
            {
                if (!empty)
                {
                    line += ' ';
                }

                line += *it;
                empty = false;
            }
        }

        if (!empty)
        {
            output.push_back(line);
        }

        return output;
    }